

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask10_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 10 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0x14 | uVar1;
  *out = uVar1;
  uVar2 = in[3];
  *out = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[1] = uVar2;
  uVar2 = in[4] << 8 | uVar2;
  out[1] = uVar2;
  uVar2 = in[5] << 0x12 | uVar2;
  out[1] = uVar2;
  uVar1 = in[6];
  out[1] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[2] = uVar1;
  uVar1 = in[7] << 6 | uVar1;
  out[2] = uVar1;
  uVar1 = in[8] << 0x10 | uVar1;
  out[2] = uVar1;
  uVar2 = in[9];
  out[2] = uVar2 << 0x1a | uVar1;
  uVar2 = uVar2 >> 6;
  out[3] = uVar2;
  uVar2 = in[10] << 4 | uVar2;
  out[3] = uVar2;
  uVar2 = in[0xb] << 0xe | uVar2;
  out[3] = uVar2;
  uVar1 = in[0xc];
  out[3] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[4] = uVar1;
  uVar1 = in[0xd] << 2 | uVar1;
  out[4] = uVar1;
  uVar1 = in[0xe] << 0xc | uVar1;
  out[4] = uVar1;
  out[4] = in[0xf] << 0x16 | uVar1;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask10_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (10 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (10 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  ++in;

  return out;
}